

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  int iVar1;
  Db *pDVar2;
  Schema *pSVar3;
  int iVar4;
  HashElem *pHVar5;
  uint iDb;
  Index *pIVar6;
  uint uVar7;
  bool bVar8;
  
  iVar1 = db->nDb;
  if (iVar1 < 1) {
    pIVar6 = (Index *)0x0;
  }
  else {
    pDVar2 = db->aDb;
    pIVar6 = (Index *)0x0;
    uVar7 = 0;
    do {
      iDb = uVar7 < 2 ^ uVar7;
      pSVar3 = pDVar2[iDb].pSchema;
      if ((zDb == (char *)0x0) || (iVar4 = sqlite3DbIsNamed(db,iDb,zDb), iVar4 != 0)) {
        pHVar5 = findElementWithHash(&pSVar3->idxHash,zName,(uint *)0x0);
        pIVar6 = (Index *)pHVar5->data;
        bVar8 = pIVar6 != (Index *)0x0;
      }
      else {
        bVar8 = false;
      }
    } while ((!bVar8) && (bVar8 = iVar1 - 1U != uVar7, uVar7 = uVar7 + 1, bVar8));
  }
  return pIVar6;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}